

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O2

unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
 duckdb::CTableFunctionLocalInit
           (ExecutionContext *context,TableFunctionInitInput *data_p,
           GlobalTableFunctionState *gstate)

{
  _Head_base<0UL,_duckdb::CTableLocalInitData_*,_false> _Var1;
  CTableBindData *pCVar2;
  pointer pCVar3;
  InvalidInputException *this;
  _Head_base<0UL,_duckdb::CTableLocalInitData_*,_false> local_70;
  CTableInternalInitInfo init_info;
  
  pCVar2 = (CTableBindData *)
           optional_ptr<const_duckdb::FunctionData,_true>::operator->
                     ((optional_ptr<const_duckdb::FunctionData,_true> *)gstate);
  make_uniq<duckdb::CTableLocalInitData>();
  if (pCVar2->info->local_init == (duckdb_table_function_init_t)0x0) {
    context->client = (ClientContext *)local_70._M_head_impl;
  }
  else {
    pCVar3 = unique_ptr<duckdb::CTableLocalInitData,_std::default_delete<duckdb::CTableLocalInitData>,_true>
             ::operator->((unique_ptr<duckdb::CTableLocalInitData,_std::default_delete<duckdb::CTableLocalInitData>,_true>
                           *)&local_70);
    init_info.init_data = &pCVar3->init_data;
    init_info.filters.ptr = (TableFilterSet *)gstate[10]._vptr_GlobalTableFunctionState;
    init_info.column_ids = (vector<unsigned_long,_true> *)(gstate + 1);
    init_info.success = true;
    init_info.error._M_dataplus._M_p = (pointer)&init_info.error.field_2;
    init_info.error._M_string_length = 0;
    init_info.error.field_2._M_local_buf[0] = '\0';
    init_info.bind_data = pCVar2;
    (*pCVar2->info->local_init)(&init_info);
    _Var1._M_head_impl = local_70._M_head_impl;
    if (init_info.success == false) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      InvalidInputException::InvalidInputException(this,&init_info.error);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_70._M_head_impl = (CTableLocalInitData *)0x0;
    context->client = (ClientContext *)_Var1._M_head_impl;
    ::std::__cxx11::string::~string((string *)&init_info.error);
    if (local_70._M_head_impl != (CTableLocalInitData *)0x0) {
      (*((local_70._M_head_impl)->super_LocalTableFunctionState)._vptr_LocalTableFunctionState[1])()
      ;
    }
  }
  return (unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
          )(unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<LocalTableFunctionState> CTableFunctionLocalInit(ExecutionContext &context, TableFunctionInitInput &data_p,
                                                            GlobalTableFunctionState *gstate) {
	auto &bind_data = data_p.bind_data->Cast<CTableBindData>();
	auto result = make_uniq<CTableLocalInitData>();
	if (!bind_data.info.local_init) {
		return std::move(result);
	}

	CTableInternalInitInfo init_info(bind_data, result->init_data, data_p.column_ids, data_p.filters);
	bind_data.info.local_init(ToCInitInfo(init_info));
	if (!init_info.success) {
		throw InvalidInputException(init_info.error);
	}
	return std::move(result);
}